

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolverLS.cpp
# Opt level: O2

double __thiscall
chrono::ChIterativeSolverLS::Solve(ChIterativeSolverLS *this,ChSystemDescriptor *sysd)

{
  uint uVar1;
  ostream *poVar2;
  RealScalar RVar3;
  ChVectorDynamic<> Ax;
  Matrix<double,__1,_1,_0,__1,_1> local_58;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_48;
  
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,0,&this->m_rhs);
  uVar1 = (*(this->super_ChIterativeSolver)._vptr_ChIterativeSolver[8])(this);
  if ((this->super_ChSolverLS).super_ChSolver.verbose == true) {
    local_48.m_lhs =
         (LhsNested)
         (this->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&local_58,(long *)&local_48);
    (*sysd->_vptr_ChSystemDescriptor[0x17])(sysd,&local_58,&this->m_sol);
    std::operator<<((ostream *)&std::cout,"  ||Ax-b|| = ");
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              (&local_48,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_58,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->m_rhs);
    RVar3 = Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_48);
    poVar2 = std::ostream::_M_insert<double>(RVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    Eigen::internal::handmade_aligned_free
              (local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
  }
  (*sysd->_vptr_ChSystemDescriptor[0x15])(sysd,&this->m_sol);
  return (double)(uVar1 & 0xff);
}

Assistant:

double ChIterativeSolverLS::Solve(ChSystemDescriptor& sysd) {
    // Assemble the problem right-hand side vector
    sysd.ConvertToMatrixForm(nullptr, &m_rhs);

    // Let the concrete solver compute the solution (in m_sol)
    bool result = SolveProblem();

    if (verbose) {
        // Calculate exact residual and report its norm
        ChVectorDynamic<> Ax(m_sol.size());
        sysd.SystemProduct(Ax, m_sol);
        std::cout << "  ||Ax-b|| = " << (Ax - m_rhs).norm() << std::endl;
    }

    //// DEBUGGING
    ////SaveMatrix(sysd);
    ////CheckSolution(sysd, m_sol);
    //// DEBUGGING

    // Scatter solution vector to the system descriptor
    sysd.FromVectorToUnknowns(m_sol);

    return result;
}